

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_debug.c
# Opt level: O1

int nni_plat_errno(int errnum)

{
  long lVar1;
  anon_struct_8_2_46f1ef69 *paVar2;
  long lVar3;
  
  if (errnum != 0) {
    if (errnum == 4) {
      errnum = 1;
    }
    else {
      if (errnum == 0xe) {
        nni_panic("System EFAULT encountered!");
      }
      lVar3 = 1;
      do {
        if (lVar3 == 0x23) {
          return errnum + 0x10000000;
        }
        lVar1 = lVar3 + 1;
        paVar2 = nni_plat_errnos + lVar3;
        lVar3 = lVar1;
      } while (paVar2->posix_err != errnum);
      errnum = *(int *)(&UNK_0013e89c + lVar1 * 8);
    }
  }
  return errnum;
}

Assistant:

int
nni_plat_errno(int errnum)
{
	int i;

	if (errnum == 0) {
		return (0);
	}
	if (errnum == EFAULT) {
		nni_panic("System EFAULT encountered!");
	}
	for (i = 0; nni_plat_errnos[i].nng_err != 0; i++) {
		if (errnum == nni_plat_errnos[i].posix_err) {
			return (nni_plat_errnos[i].nng_err);
		}
	}
	// Other system errno.
	return (NNG_ESYSERR + errnum);
}